

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O0

shared_ptr<opentracing::v3::Tracer> __thiscall
jaegertracing::testutils::TracerUtil::buildTracer(TracerUtil *this,string *endpoint)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<opentracing::v3::Tracer> sVar1;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  local_5f0;
  shared_ptr<jaegertracing::logging::Logger> local_5e8;
  allocator local_5d1;
  string local_5d0;
  undefined1 local_5a9;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_5a8;
  allocator local_581;
  string local_580;
  duration local_560;
  allocator local_551;
  string local_550;
  RestrictionsConfig local_530;
  HeadersConfig local_500;
  allocator local_479;
  string local_478;
  int local_454;
  duration<long,_std::ratio<1L,_1000L>_> local_450;
  duration local_448;
  Config local_440;
  duration local_3e8;
  string local_3e0;
  allocator local_3a9;
  string local_3a8;
  Config local_388;
  undefined1 local_330 [8];
  Config config;
  ostringstream samplingServerURLStream;
  string *endpoint_local;
  shared_ptr<opentracing::v3::Tracer> *tracer;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&config._baggageRestrictions._refreshInterval);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"const",&local_3a9);
  std::__cxx11::ostringstream::str();
  local_3e8.__r = 0;
  samplers::Config::Config(&local_388,&local_3a8,1.0,&local_3e0,0,&local_3e8);
  local_454 = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_450,&local_454);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_448,&local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"",&local_479);
  reporters::Config::Config(&local_440,0,&local_448,false,&local_478,endpoint);
  propagation::HeadersConfig::HeadersConfig(&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"",&local_551);
  local_560.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_530,false,&local_550,&local_560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"",&local_581);
  local_5a8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_5a8);
  Config::Config((Config *)local_330,false,&local_388,&local_440,&local_500,&local_530,&local_580,
                 &local_5a8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_5a8);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  propagation::HeadersConfig::~HeadersConfig(&local_500);
  reporters::Config::~Config(&local_440);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  samplers::Config::~Config(&local_388);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  local_5a9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"test-service",&local_5d1);
  jaegertracing::logging::nullLogger();
  std::shared_ptr<jaegertracing::logging::Logger>::
  shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            (&local_5e8,&local_5f0);
  Tracer::make((Tracer *)this,&local_5d0,(Config *)local_330,&local_5e8);
  std::shared_ptr<jaegertracing::logging::Logger>::~shared_ptr(&local_5e8);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr(&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  local_5a9 = 1;
  Config::~Config((Config *)local_330);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&config._baggageRestrictions._refreshInterval);
  sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<opentracing::v3::Tracer>)
         sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<opentracing::Tracer> buildTracer(const std::string& endpoint)
{
    std::ostringstream samplingServerURLStream;
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          std::chrono::milliseconds(100),
                          false, "", endpoint),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    return tracer;
}